

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.h
# Opt level: O3

void __thiscall enact::OptionalTypename::~OptionalTypename(OptionalTypename *this)

{
  ~OptionalTypename(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~OptionalTypename() override = default;